

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt_callback.cpp
# Opt level: O0

void __thiscall OmptInterface::target_end(OmptInterface *this,int64_t device_id)

{
  ompt_callback_target_t p_Var1;
  ompt_data_t *poVar2;
  ompt_id_t *poVar3;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  
  p_Var1 = ompt_callback_target_fn;
  if ((ompt_enabled) && (ompt_callback_target_fn != (ompt_callback_target_t)0x0)) {
    poVar2 = (*ompt_get_task_data_fn)();
    poVar3 = (ompt_id_t *)__tls_get_addr(&PTR_0012af90);
    (*p_Var1)(ompt_target,ompt_scope_end,in_ESI,poVar2,*poVar3,*(void **)(in_RDI + 8));
    in_stack_ffffffffffffffd4 = in_ESI;
  }
  target_region_end((OmptInterface *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

void OmptInterface::target_end(int64_t device_id) {
  OMPT_CALLBACK(ompt_callback_target_fn, 
    (ompt_target, 
     ompt_scope_end,
     device_id,
     ompt_get_task_data_fn(), 
     ompt_target_region_id, 
     _codeptr_ra
    )); 
  target_region_end();
}